

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seat.hpp
# Opt level: O0

unique_ptr<seat,_std::default_delete<seat>_> __thiscall
seat::createSeat<Disabled>
          (seat *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *PriceMap)

{
  Disabled local_70;
  undefined1 local_20 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *PriceMap_local;
  
  local_20._8_8_ = PriceMap;
  PriceMap_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        *)this;
  Disabled::Disabled(&local_70,PriceMap);
  std::make_unique<Disabled,Disabled>((Disabled *)local_20);
  std::unique_ptr<seat,std::default_delete<seat>>::
  unique_ptr<Disabled,std::default_delete<Disabled>,void>
            ((unique_ptr<seat,std::default_delete<seat>> *)this,
             (unique_ptr<Disabled,_std::default_delete<Disabled>_> *)local_20);
  std::unique_ptr<Disabled,_std::default_delete<Disabled>_>::~unique_ptr
            ((unique_ptr<Disabled,_std::default_delete<Disabled>_> *)local_20);
  Disabled::~Disabled(&local_70);
  return (__uniq_ptr_data<seat,_std::default_delete<seat>,_true,_true>)
         (__uniq_ptr_data<seat,_std::default_delete<seat>,_true,_true>)this;
}

Assistant:

static std::unique_ptr<seat> createSeat(std::map<std::string, size_t> &PriceMap) // Produce new object of subclass
    {
        return std::make_unique<T>(T(PriceMap));
    }